

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.cpp
# Opt level: O3

void __thiscall Flasher::erase(Flasher *this,uint32_t foffset)

{
  Flash *pFVar1;
  
  (*this->_observer->_vptr_FlasherObserver[2])(this->_observer,"Erase flash\n");
  pFVar1 = (this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
           super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
           super__Head_base<0UL,_Flash_*,_false>._M_head_impl;
  (*pFVar1->_vptr_Flash[8])(pFVar1,foffset);
  pFVar1 = (this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
           super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
           super__Head_base<0UL,_Flash_*,_false>._M_head_impl;
  (*pFVar1->_vptr_Flash[9])(pFVar1,0);
  return;
}

Assistant:

void
Flasher::erase(uint32_t foffset)
{
    _observer.onStatus("Erase flash\n");
    _flash->eraseAll(foffset);
    _flash->eraseAuto(false);
}